

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O2

void __thiscall
FListMenuItemPlayerDisplay::FListMenuItemPlayerDisplay
          (FListMenuItemPlayerDisplay *this,FListMenuDescriptor *menu,int x,int y,PalEntry c1,
          PalEntry c2,bool np,FName *action)

{
  BYTE BVar1;
  FBackdropTexture *this_00;
  uint b;
  uint g;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  iVar3 = action->Index;
  (this->super_FListMenuItem).mXpos = x;
  (this->super_FListMenuItem).mYpos = y;
  (this->super_FListMenuItem).mAction.Index = iVar3;
  (this->super_FListMenuItem).mEnabled = true;
  (this->super_FListMenuItem)._vptr_FListMenuItem =
       (_func_int **)&PTR__FListMenuItemPlayerDisplay_006e8e28;
  FRemapTable::FRemapTable(&this->mRemap,0x100);
  this->mOwner = menu;
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    iVar3 = (uVar4 & 0xffff) / 0xff + ((uint)c1.field_0 >> 0x10 & 0xff);
    g = (uVar5 & 0xffff) / 0xff + ((uint)c1.field_0 >> 8 & 0xff);
    b = (uVar6 & 0xffff) / 0xff + ((uint)c1.field_0 & 0xff);
    BVar1 = FColorMatcher::Pick(&ColorMatcher,iVar3,g,b);
    (this->mRemap).Remap[lVar2] = BVar1;
    (this->mRemap).Palette[lVar2].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)
         (b & 0xff | (g & 0xff) << 8 | iVar3 * 0x10000 | 0xff000000);
    uVar6 = uVar6 + ((uint)c2.field_0 & 0xff);
    uVar5 = uVar5 + ((uint)c2.field_0 >> 8 & 0xff);
    uVar4 = uVar4 + ((uint)c2.field_0 >> 0x10 & 0xff);
  }
  this_00 = (FBackdropTexture *)operator_new(0x5e78);
  FBackdropTexture::FBackdropTexture(this_00);
  this->mBackdrop = (FTexture *)this_00;
  this->mPlayerClass = (FPlayerClass *)0x0;
  this->mPlayerState = (FState *)0x0;
  this->mNoportrait = np;
  *(undefined8 *)&this->mRotation = 0;
  this->mRandomClass = 0;
  this->mRandomTimer = 0;
  this->mClassNum = -1;
  return;
}

Assistant:

FListMenuItemPlayerDisplay::FListMenuItemPlayerDisplay(FListMenuDescriptor *menu, int x, int y, PalEntry c1, PalEntry c2, bool np, FName action)
: FListMenuItem(x, y, action)
{
	mOwner = menu;

	for (int i = 0; i < 256; i++)
	{
		int r = c1.r + c2.r * i / 255;
		int g = c1.g + c2.g * i / 255;
		int b = c1.b + c2.b * i / 255;
		mRemap.Remap[i] = ColorMatcher.Pick (r, g, b);
		mRemap.Palette[i] = PalEntry(255, r, g, b);
	}
	mBackdrop = new FBackdropTexture;
	mPlayerClass = NULL;
	mPlayerState = NULL;
	mNoportrait = np;
	mMode = 0;
	mRotation = 0;
	mTranslate = false;
	mSkin = 0;
	mRandomClass = 0;
	mRandomTimer = 0;
	mClassNum = -1;
}